

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O2

SUNErrCode N_VWrmsNormVectorArray(int nvec,N_Vector *X,N_Vector *W,sunrealtype *nrm)

{
  _func_SUNErrCode_int_N_Vector_ptr_N_Vector_ptr_sunrealtype_ptr *UNRECOVERED_JUMPTABLE;
  SUNErrCode SVar1;
  ulong uVar2;
  ulong uVar3;
  sunrealtype sVar4;
  
  UNRECOVERED_JUMPTABLE = (*X)->ops->nvwrmsnormvectorarray;
  if (UNRECOVERED_JUMPTABLE != (_func_SUNErrCode_int_N_Vector_ptr_N_Vector_ptr_sunrealtype_ptr *)0x0
     ) {
    SVar1 = (*UNRECOVERED_JUMPTABLE)(nvec,X,W,nrm);
    return SVar1;
  }
  uVar3 = 0;
  uVar2 = (ulong)(uint)nvec;
  if (nvec < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    sVar4 = (*(*X)->ops->nvwrmsnorm)(X[uVar3],W[uVar3]);
    nrm[uVar3] = sVar4;
  }
  return 0;
}

Assistant:

SUNErrCode N_VWrmsNormVectorArray(int nvec, N_Vector* X, N_Vector* W,
                                  sunrealtype* nrm)
{
  int i;
  SUNErrCode ier;

  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(X[0]));

  if (X[0]->ops->nvwrmsnormvectorarray != NULL)
  {
    ier = X[0]->ops->nvwrmsnormvectorarray(nvec, X, W, nrm);
  }
  else
  {
    for (i = 0; i < nvec; i++) { nrm[i] = X[0]->ops->nvwrmsnorm(X[i], W[i]); }
    ier = SUN_SUCCESS;
  }

  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(X[0]));
  return (ier);
}